

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,undefined8 branchIndex,
          NoInfer<kj::ArrayPtr<const_char>_> *first,NoInfer<kj::ArrayPtr<const_char>_> *rest,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_1,NoInfer<kj::ArrayPtr<const_char>_> *rest_2,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_3,NoInfer<kj::ArrayPtr<const_char>_> *rest_4,
          NoInfer<kj::String> *rest_5,NoInfer<kj::ArrayPtr<const_char>_> *rest_6,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_7,NoInfer<kj::ArrayPtr<const_char>_> *rest_8,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_9,NoInfer<kj::ArrayPtr<const_char>_> *rest_10,
          NoInfer<kj::StringTree> *rest_11,NoInfer<kj::ArrayPtr<const_char>_> *rest_12,
          NoInfer<kj::String> *rest_13,NoInfer<kj::ArrayPtr<const_char>_> *rest_14,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_15,NoInfer<kj::ArrayPtr<const_char>_> *rest_16,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_17,NoInfer<kj::ArrayPtr<const_char>_> *rest_18,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_19,NoInfer<kj::ArrayPtr<const_char>_> *rest_20,
          NoInfer<kj::String> *rest_21,NoInfer<kj::ArrayPtr<const_char>_> *rest_22,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_23,NoInfer<kj::ArrayPtr<const_char>_> *rest_24
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_25,NoInfer<kj::ArrayPtr<const_char>_> *rest_26,
          NoInfer<kj::StringTree> *rest_27,NoInfer<kj::StringTree> *rest_28,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_29,NoInfer<kj::ArrayPtr<const_char>_> *rest_30,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_31,NoInfer<kj::ArrayPtr<const_char>_> *rest_32,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_33,NoInfer<kj::String> *rest_34,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_35,NoInfer<kj::ArrayPtr<const_char>_> *rest_36,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_37,NoInfer<kj::String> *rest_38,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_39,NoInfer<kj::CappedArray<char,_14UL>_> *rest_40
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_41,NoInfer<kj::StringTree> *rest_42,
          NoInfer<kj::StringTree> *rest_43,NoInfer<kj::StringTree> *rest_44,
          NoInfer<kj::StringTree> *rest_45,NoInfer<kj::ArrayPtr<const_char>_> *rest_46,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_47,NoInfer<kj::ArrayPtr<const_char>_> *rest_48,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_49,NoInfer<kj::ArrayPtr<const_char>_> *rest_50,
          NoInfer<kj::String> *rest_51,NoInfer<kj::ArrayPtr<const_char>_> *rest_52,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_53,NoInfer<kj::ArrayPtr<const_char>_> *rest_54,
          NoInfer<kj::String> *rest_55,NoInfer<kj::ArrayPtr<const_char>_> *rest_56,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_57,NoInfer<kj::ArrayPtr<const_char>_> *rest_58
          ,NoInfer<kj::StringTree> *rest_59,NoInfer<kj::StringTree> *rest_60,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_61,NoInfer<kj::String> *rest_62,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_63)

{
  ArrayPtr<const_char> *pAVar1;
  char *pcVar2;
  ArrayPtr<const_char> *pAVar3;
  ArrayPtr<const_char> *pAVar4;
  ArrayPtr<const_char> *pAVar5;
  ArrayPtr<const_char> *pAVar6;
  String *pSVar7;
  ArrayPtr<const_char> *pAVar8;
  CappedArray<char,_14UL> *pCVar9;
  ArrayPtr<const_char> *pAVar10;
  ArrayPtr<const_char> *pAVar11;
  ArrayPtr<const_char> *pAVar12;
  StringTree *pSVar13;
  ArrayPtr<const_char> *pAVar14;
  String *pSVar15;
  ArrayPtr<const_char> *pAVar16;
  ArrayPtr<const_char> *pAVar17;
  ArrayPtr<const_char> *pAVar18;
  ArrayPtr<const_char> *pAVar19;
  ArrayPtr<const_char> *pAVar20;
  ArrayPtr<const_char> *pAVar21;
  ArrayPtr<const_char> *pAVar22;
  String *pSVar23;
  ArrayPtr<const_char> *pAVar24;
  CappedArray<char,_14UL> *pCVar25;
  ArrayPtr<const_char> *pAVar26;
  ArrayPtr<const_char> *pAVar27;
  ArrayPtr<const_char> *pAVar28;
  StringTree *pSVar29;
  StringTree *pSVar30;
  ArrayPtr<const_char> *pAVar31;
  ArrayPtr<const_char> *pAVar32;
  ArrayPtr<const_char> *pAVar33;
  ArrayPtr<const_char> *pAVar34;
  ArrayPtr<const_char> *pAVar35;
  String *pSVar36;
  ArrayPtr<const_char> *pAVar37;
  ArrayPtr<const_char> *pAVar38;
  ArrayPtr<const_char> *pAVar39;
  String *pSVar40;
  ArrayPtr<const_char> *pAVar41;
  CappedArray<char,_14UL> *pCVar42;
  ArrayPtr<const_char> *pAVar43;
  StringTree *pSVar44;
  StringTree *pSVar45;
  StringTree *pSVar46;
  StringTree *pSVar47;
  ArrayPtr<const_char> *pAVar48;
  ArrayPtr<const_char> *pAVar49;
  ArrayPtr<const_char> *pAVar50;
  ArrayPtr<const_char> *pAVar51;
  ArrayPtr<const_char> *pAVar52;
  String *pSVar53;
  ArrayPtr<const_char> *pAVar54;
  ArrayPtr<const_char> *pAVar55;
  ArrayPtr<const_char> *pAVar56;
  String *pSVar57;
  ArrayPtr<const_char> *pAVar58;
  CappedArray<char,_14UL> *pCVar59;
  ArrayPtr<const_char> *pAVar60;
  StringTree *pSVar61;
  StringTree *pSVar62;
  ArrayPtr<const_char> *pAVar63;
  String *pSVar64;
  ArrayPtr<const_char> *pAVar65;
  ArrayPtr<const_char> *pAVar66;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000001f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000200;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000208;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000210;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000218;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000220;
  NoInfer<kj::String> *in_stack_00000228;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000230;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000238;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000240;
  NoInfer<kj::StringTree> *in_stack_00000248;
  NoInfer<kj::StringTree> *in_stack_00000250;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000258;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pcVar2 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  pAVar4 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  pAVar5 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pSVar7 = fwd<kj::String>(rest_5);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pCVar9 = fwd<kj::CappedArray<char,14ul>>(rest_7);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  pAVar11 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  pAVar12 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  pSVar13 = fwd<kj::StringTree>(rest_11);
  pAVar14 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  pSVar15 = fwd<kj::String>(rest_13);
  pAVar16 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pAVar18 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  pAVar19 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  pAVar20 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  pAVar21 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  pAVar22 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  pSVar23 = fwd<kj::String>(rest_21);
  pAVar24 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  pCVar25 = fwd<kj::CappedArray<char,14ul>>(rest_23);
  pAVar26 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  pAVar27 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  pAVar28 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  pSVar29 = fwd<kj::StringTree>(rest_27);
  pSVar30 = fwd<kj::StringTree>(rest_28);
  pAVar31 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pAVar33 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  pAVar34 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  pAVar35 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  pSVar36 = fwd<kj::String>(rest_34);
  pAVar37 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  pAVar38 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  pAVar39 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  pSVar40 = fwd<kj::String>(rest_38);
  pAVar41 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pCVar42 = fwd<kj::CappedArray<char,14ul>>(rest_40);
  pAVar43 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  pSVar44 = fwd<kj::StringTree>(rest_42);
  pSVar45 = fwd<kj::StringTree>(rest_43);
  pSVar46 = fwd<kj::StringTree>(rest_44);
  pSVar47 = fwd<kj::StringTree>(rest_45);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_46);
  pAVar49 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  pAVar50 = fwd<kj::ArrayPtr<char_const>>(rest_48);
  pAVar51 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  pAVar52 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  pSVar53 = fwd<kj::String>(rest_51);
  pAVar54 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  pAVar55 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_54);
  pSVar57 = fwd<kj::String>(rest_55);
  pAVar58 = fwd<kj::ArrayPtr<char_const>>(rest_56);
  pCVar59 = fwd<kj::CappedArray<char,14ul>>(rest_57);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_58);
  pSVar61 = fwd<kj::StringTree>(rest_59);
  pSVar62 = fwd<kj::StringTree>(rest_60);
  pAVar63 = fwd<kj::ArrayPtr<char_const>>(rest_61);
  pSVar64 = fwd<kj::String>(rest_62);
  pAVar65 = fwd<kj::ArrayPtr<char_const>>(rest_63);
  pAVar66 = fwd<kj::ArrayPtr<char_const>>(in_stack_000001f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000208);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000210);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000218);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000220);
  fwd<kj::String>(in_stack_00000228);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000238);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  fwd<kj::StringTree>(in_stack_00000248);
  fwd<kj::StringTree>(in_stack_00000250);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000258);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,pcVar2,branchIndex,pAVar1,pAVar3,pAVar4,pAVar5,pAVar6,pSVar7,pAVar8,pCVar9,pAVar10
             ,pAVar11,pAVar12,pSVar13,pAVar14,pSVar15,pAVar16,pAVar17,pAVar18,pAVar19,pAVar20,
             pAVar21,pAVar22,pSVar23,pAVar24,pCVar25,pAVar26,pAVar27,pAVar28,pSVar29,pSVar30,pAVar31
             ,pAVar32,pAVar33,pAVar34,pAVar35,pSVar36,pAVar37,pAVar38,pAVar39,pSVar40,pAVar41,
             pCVar42,pAVar43,pSVar44,pSVar45,pSVar46,pSVar47,pAVar48,pAVar49,pAVar50,pAVar51,pAVar52
             ,pSVar53,pAVar54,pAVar55,pAVar56,pSVar57,pAVar58,pCVar59,pAVar60,pSVar61,pSVar62,
             pAVar63,pSVar64,pAVar65,pAVar66);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}